

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_69183b::cmLoadedCommand::InitialPass
          (cmLoadedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  int argc_00;
  element_type *peVar1;
  size_type sVar2;
  char *pcVar3;
  allocator<char> local_91;
  string local_90;
  anon_class_16_1_898d0f1e local_60;
  undefined1 local_50 [8];
  shared_ptr<(anonymous_namespace)::LoadedCommandImpl> impl;
  int result;
  int i;
  char **argv;
  int argc;
  cmExecutionStatus *param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmLoadedCommand *this_local;
  
  peVar1 = std::
           __shared_ptr_access<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->Impl);
  if ((peVar1->super_cmLoadedCommandInfo).InitialPass == (CM_INITIAL_PASS_FUNCTION)0x0) {
    this_local._7_1_ = true;
  }
  else {
    peVar1 = std::
             __shared_ptr_access<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->Impl);
    if ((peVar1->super_cmLoadedCommandInfo).Error != (char *)0x0) {
      peVar1 = std::
               __shared_ptr_access<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->Impl);
      free((peVar1->super_cmLoadedCommandInfo).Error);
    }
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    argc_00 = (int)sVar2;
    _result = (char **)0x0;
    if (argc_00 != 0) {
      _result = (char **)malloc((long)argc_00 << 3);
    }
    for (impl.
         super___shared_ptr<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._4_4_ = 0;
        impl.
        super___shared_ptr<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ < argc_00;
        impl.
        super___shared_ptr<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ =
             impl.
             super___shared_ptr<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi._4_4_ + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](args,(long)impl.
                              super___shared_ptr<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi._4_4_);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pcVar3 = strdup(pcVar3);
      _result[impl.
              super___shared_ptr<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi._4_4_] = pcVar3;
    }
    peVar1 = std::
             __shared_ptr_access<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->Impl);
    impl.super___shared_ptr<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ =
         LoadedCommandImpl::DoInitialPass(peVar1,(this->super_cmCommand).Makefile,argc_00,_result);
    cmFreeArguments(argc_00,_result);
    if ((int)impl.
             super___shared_ptr<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi == 0) {
      peVar1 = std::
               __shared_ptr_access<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->Impl);
      if ((peVar1->super_cmLoadedCommandInfo).Error != (char *)0x0) {
        peVar1 = std::
                 __shared_ptr_access<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->Impl);
        pcVar3 = (peVar1->super_cmLoadedCommandInfo).Error;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar3,&local_91);
        cmCommand::SetError(&this->super_cmCommand,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator(&local_91);
      }
      this_local._7_1_ = false;
    }
    else {
      peVar1 = std::
               __shared_ptr_access<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->Impl);
      if ((peVar1->super_cmLoadedCommandInfo).FinalPass != (CM_FINAL_PASS_FUNCTION)0x0) {
        std::shared_ptr<(anonymous_namespace)::LoadedCommandImpl>::shared_ptr
                  ((shared_ptr<(anonymous_namespace)::LoadedCommandImpl> *)local_50,&this->Impl);
        this_00 = (this->super_cmCommand).Makefile;
        std::shared_ptr<(anonymous_namespace)::LoadedCommandImpl>::shared_ptr
                  (&local_60.impl,(shared_ptr<(anonymous_namespace)::LoadedCommandImpl> *)local_50);
        cmMakefile::
        AddGeneratorAction<(anonymous_namespace)::cmLoadedCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0>
                  (this_00,&local_60);
        (anonymous_namespace)::cmLoadedCommand::
        InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::$_0::~__0((__0 *)&local_60);
        std::shared_ptr<(anonymous_namespace)::LoadedCommandImpl>::~shared_ptr
                  ((shared_ptr<(anonymous_namespace)::LoadedCommandImpl> *)local_50);
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmLoadedCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  if (!this->Impl->InitialPass) {
    return true;
  }

  // clear the error string
  if (this->Impl->Error) {
    free(this->Impl->Error);
  }

  // create argc and argv and then invoke the command
  int argc = static_cast<int>(args.size());
  char** argv = nullptr;
  if (argc) {
    argv = static_cast<char**>(malloc(argc * sizeof(char*)));
  }
  int i;
  for (i = 0; i < argc; ++i) {
    argv[i] = strdup(args[i].c_str());
  }
  int result = this->Impl->DoInitialPass(this->Makefile, argc, argv);
  cmFreeArguments(argc, argv);

  if (result) {
    if (this->Impl->FinalPass) {
      auto impl = this->Impl;
      this->Makefile->AddGeneratorAction(
        [impl](cmLocalGenerator& lg, const cmListFileBacktrace&) {
          impl->DoFinalPass(lg.GetMakefile());
        });
    }
    return true;
  }

  /* Initial Pass must have failed so set the error string */
  if (this->Impl->Error) {
    this->SetError(this->Impl->Error);
  }
  return false;
}